

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O1

scoped_fd * __thiscall phosg::scoped_fd::operator=(scoped_fd *this,scoped_fd *other)

{
  if (-1 < this->fd) {
    ::close(this->fd);
    this->fd = -1;
  }
  this->fd = other->fd;
  other->fd = -1;
  return this;
}

Assistant:

scoped_fd& scoped_fd::operator=(scoped_fd&& other) {
  this->close();
  this->fd = other.fd;
  other.fd = -1;
  return *this;
}